

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O2

void __thiscall Assimp::BVHLoader::CreateAnimation(BVHLoader *this,aiScene *pScene)

{
  undefined8 *puVar1;
  _Rb_tree_header *p_Var2;
  uint uVar3;
  aiNode *paVar4;
  size_type sVar5;
  uint i;
  int iVar6;
  aiAnimation **ppaVar7;
  aiAnimation *this_00;
  ulong uVar8;
  aiNodeAnim **ppaVar9;
  ulong uVar10;
  aiNodeAnim *paVar11;
  mapped_type_conflict *pmVar12;
  aiVectorKey *paVar13;
  iterator iVar14;
  aiQuatKey *paVar15;
  DeadlyImportError *pDVar16;
  long lVar17;
  aiQuatKey *paVar18;
  long lVar19;
  uint channel;
  pointer pNVar20;
  float fVar21;
  float fVar22;
  key_type local_fc;
  undefined1 local_f8 [28];
  undefined8 uStack_dc;
  BVHLoader *local_d0;
  aiAnimation *local_c8;
  float local_bc;
  undefined1 local_b8 [32];
  float local_98;
  aiVectorKey **local_90;
  ulong local_88;
  string nodeName;
  map<Assimp::BVHLoader::ChannelType,_int,_std::less<Assimp::BVHLoader::ChannelType>,_std::allocator<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>_>
  channelMap;
  
  pScene->mNumAnimations = 1;
  ppaVar7 = (aiAnimation **)operator_new__(8);
  pScene->mAnimations = ppaVar7;
  this_00 = (aiAnimation *)operator_new(0x448);
  aiAnimation::aiAnimation(this_00);
  *pScene->mAnimations = this_00;
  aiString::Set((aiString *)this_00,"Motion");
  this_00->mTicksPerSecond = 1.0 / (double)this->mAnimTickDuration;
  this_00->mDuration = (double)(this->mAnimNumFrames - 1);
  uVar8 = ((long)(this->mNodes).
                 super__Vector_base<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->mNodes).
                super__Vector_base<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x38;
  this_00->mNumChannels = (uint)uVar8;
  local_d0 = this;
  ppaVar9 = (aiNodeAnim **)operator_new__((uVar8 & 0xffffffff) << 3);
  this_00->mChannels = ppaVar9;
  for (uVar10 = 0; uVar10 < (uVar8 & 0xffffffff); uVar10 = uVar10 + 1) {
    this_00->mChannels[uVar10] = (aiNodeAnim *)0x0;
    uVar8 = (ulong)this_00->mNumChannels;
  }
  p_Var2 = &channelMap._M_t._M_impl.super__Rb_tree_header;
  uVar10 = 0;
  local_c8 = this_00;
  do {
    if ((uVar8 & 0xffffffff) <= uVar10) {
      return;
    }
    pNVar20 = (local_d0->mNodes).
              super__Vector_base<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>.
              _M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nodeName,((pNVar20[uVar10].mNode)->mName).data,
               (allocator<char> *)&channelMap);
    paVar11 = (aiNodeAnim *)operator_new(0x438);
    (paVar11->mNodeName).length = 0;
    (paVar11->mNodeName).data[0] = '\0';
    memset((paVar11->mNodeName).data + 1,0x1b,0x3ff);
    sVar5 = nodeName._M_string_length;
    paVar11->mRotationKeys = (aiQuatKey *)0x0;
    paVar11->mNumScalingKeys = 0;
    *(undefined8 *)&paVar11->mNumPositionKeys = 0;
    *(undefined8 *)((long)&paVar11->mPositionKeys + 4) = 0;
    paVar11->mScalingKeys = (aiVectorKey *)0x0;
    paVar11->mPreState = aiAnimBehaviour_DEFAULT;
    paVar11->mPostState = aiAnimBehaviour_DEFAULT;
    local_c8->mChannels[uVar10] = paVar11;
    local_88 = uVar10;
    if (nodeName._M_string_length < 0x400) {
      (paVar11->mNodeName).length = (ai_uint32)nodeName._M_string_length;
      memcpy((paVar11->mNodeName).data,nodeName._M_dataplus._M_p,nodeName._M_string_length);
      (paVar11->mNodeName).data[sVar5] = '\0';
    }
    pNVar20 = pNVar20 + uVar10;
    channelMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    channelMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_90 = &paVar11->mScalingKeys;
    channelMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    uVar8 = 0;
    channelMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    channelMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    while( true ) {
      lVar17 = *(long *)&(pNVar20->mChannels).
                         super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                         ._M_impl.super__Vector_impl_data;
      lVar19 = (long)*(pointer *)
                      ((long)&(pNVar20->mChannels).
                              super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                              ._M_impl + 8) - lVar17;
      if ((ulong)(lVar19 >> 2) <= uVar8) break;
      pmVar12 = std::
                map<Assimp::BVHLoader::ChannelType,_int,_std::less<Assimp::BVHLoader::ChannelType>,_std::allocator<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>_>
                ::operator[](&channelMap,(key_type *)(lVar17 + uVar8 * 4));
      *pmVar12 = (int)uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    }
    if (lVar19 == 0x18) {
      uVar3 = local_d0->mAnimNumFrames;
      uVar8 = (ulong)uVar3;
      paVar11->mNumPositionKeys = uVar3;
      paVar13 = (aiVectorKey *)operator_new__(uVar8 * 0x18);
      if (uVar3 != 0) {
        uVar10 = 0;
        do {
          *(undefined4 *)((long)&(paVar13->mValue).z + uVar10) = 0;
          puVar1 = (undefined8 *)((long)&paVar13->mTime + uVar10);
          *puVar1 = 0;
          puVar1[1] = 0;
          uVar10 = uVar10 + 0x18;
        } while (uVar8 * 0x18 != uVar10);
      }
      paVar11->mPositionKeys = paVar13;
      for (uVar10 = 0; uVar10 < uVar8; uVar10 = uVar10 + 1) {
        paVar13->mTime = (double)(uVar10 & 0xffffffff);
        iVar6 = 0;
        while (local_f8._0_4_ = iVar6, iVar6 < 3) {
          iVar14 = std::
                   _Rb_tree<Assimp::BVHLoader::ChannelType,_std::pair<const_Assimp::BVHLoader::ChannelType,_int>,_std::_Select1st<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>,_std::less<Assimp::BVHLoader::ChannelType>,_std::allocator<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>_>
                   ::find((_Rb_tree<Assimp::BVHLoader::ChannelType,_std::pair<const_Assimp::BVHLoader::ChannelType,_int>,_std::_Select1st<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>,_std::less<Assimp::BVHLoader::ChannelType>,_std::allocator<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>_>
                           *)&channelMap,(key_type *)local_f8);
          if ((_Rb_tree_header *)iVar14._M_node == p_Var2) {
            pDVar16 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_b8,"Missing position channel in node ",&nodeName);
            DeadlyImportError::DeadlyImportError(pDVar16,(string *)local_b8);
            __cxa_throw(pDVar16,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          lVar17 = (long)*(int *)&iVar14._M_node[1].field_0x4;
          if ((float)local_f8._0_4_ == 2.8026e-45) {
            (paVar13->mValue).z =
                 *(float *)(((ulong)((long)*(pointer *)
                                            ((long)&(pNVar20->mChannels).
                                                                                                        
                                                  super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                                                  ._M_impl + 8) -
                                    *(long *)&(pNVar20->mChannels).
                                              super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                                              ._M_impl.super__Vector_impl_data) >> 2) * uVar10 * 4 +
                            *(long *)&(pNVar20->mChannelValues).
                                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data + lVar17 * 4);
          }
          else if ((float)local_f8._0_4_ == 1.4013e-45) {
            (paVar13->mValue).y =
                 *(float *)(((ulong)((long)*(pointer *)
                                            ((long)&(pNVar20->mChannels).
                                                                                                        
                                                  super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                                                  ._M_impl + 8) -
                                    *(long *)&(pNVar20->mChannels).
                                              super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                                              ._M_impl.super__Vector_impl_data) >> 2) * uVar10 * 4 +
                            *(long *)&(pNVar20->mChannelValues).
                                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data + lVar17 * 4);
          }
          else if ((float)local_f8._0_4_ == 0.0) {
            (paVar13->mValue).x =
                 *(float *)(((ulong)((long)*(pointer *)
                                            ((long)&(pNVar20->mChannels).
                                                                                                        
                                                  super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                                                  ._M_impl + 8) -
                                    *(long *)&(pNVar20->mChannels).
                                              super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                                              ._M_impl.super__Vector_impl_data) >> 2) * uVar10 * 4 +
                            *(long *)&(pNVar20->mChannelValues).
                                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data + lVar17 * 4);
          }
          iVar6 = local_f8._0_4_ + 1;
        }
        paVar13 = paVar13 + 1;
        uVar8 = (ulong)local_d0->mAnimNumFrames;
      }
    }
    else {
      paVar4 = pNVar20->mNode;
      fVar21 = (paVar4->mTransformation).a4;
      fVar22 = (paVar4->mTransformation).b4;
      local_bc = (paVar4->mTransformation).c4;
      paVar11->mNumPositionKeys = 1;
      paVar13 = (aiVectorKey *)operator_new__(0x18);
      paVar11->mPositionKeys = paVar13;
      paVar13->mTime = 0.0;
      (paVar13->mValue).x = fVar21;
      (paVar13->mValue).y = fVar22;
      (paVar13->mValue).z = local_bc;
      uVar8 = (ulong)local_d0->mAnimNumFrames;
    }
    paVar11->mNumRotationKeys = (uint)uVar8;
    paVar15 = (aiQuatKey *)operator_new__(uVar8 * 0x18);
    if ((uint)uVar8 != 0) {
      paVar18 = paVar15;
      do {
        paVar18->mTime = 0.0;
        (paVar18->mValue).w = 1.0;
        (paVar18->mValue).x = 0.0;
        (paVar18->mValue).y = 0.0;
        (paVar18->mValue).z = 0.0;
        paVar18 = paVar18 + 1;
      } while (paVar18 != paVar15 + uVar8);
    }
    paVar11->mRotationKeys = paVar15;
    for (uVar10 = 0; uVar10 < uVar8; uVar10 = uVar10 + 1) {
      local_b8._0_8_ = (pointer)0x3f800000;
      local_b8._8_8_ = 0;
      local_b8._16_8_ = 0x3f800000;
      local_b8._24_4_ = 0.0;
      local_b8._28_4_ = 0.0;
      local_98 = 1.0;
      for (local_fc = Channel_RotationX; (int)local_fc < 6; local_fc = local_fc + Channel_PositionY)
      {
        iVar14 = std::
                 _Rb_tree<Assimp::BVHLoader::ChannelType,_std::pair<const_Assimp::BVHLoader::ChannelType,_int>,_std::_Select1st<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>,_std::less<Assimp::BVHLoader::ChannelType>,_std::allocator<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>_>
                 ::find((_Rb_tree<Assimp::BVHLoader::ChannelType,_std::pair<const_Assimp::BVHLoader::ChannelType,_int>,_std::_Select1st<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>,_std::less<Assimp::BVHLoader::ChannelType>,_std::allocator<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>_>
                         *)&channelMap,&local_fc);
        if ((_Rb_tree_header *)iVar14._M_node == p_Var2) {
          pDVar16 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f8,"Missing rotation channel in node ",&nodeName);
          DeadlyImportError::DeadlyImportError(pDVar16,(string *)local_f8);
          __cxa_throw(pDVar16,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        fVar21 = (*(float *)(((ulong)((long)*(pointer *)
                                             ((long)&(pNVar20->mChannels).
                                                                                                          
                                                  super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                                                  ._M_impl + 8) -
                                     *(long *)&(pNVar20->mChannels).
                                               super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                                               ._M_impl.super__Vector_impl_data) >> 2) * uVar10 * 4
                             + *(long *)&(pNVar20->mChannelValues).
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data +
                            (long)*(int *)&iVar14._M_node[1].field_0x4 * 4) * 3.1415927) / 180.0;
        if (local_fc == Channel_RotationZ) {
          fVar22 = cosf(fVar21);
          local_f8._12_4_ = sinf(fVar21);
          local_f8._0_8_ = CONCAT44(local_f8._12_4_,fVar22) ^ 0x8000000000000000;
          local_f8._8_4_ = 0.0;
          local_f8._20_8_ = 0;
          uStack_dc = 0x3f80000000000000;
          local_f8._16_4_ = fVar22;
          aiMatrix3x3t<float>::operator*=
                    ((aiMatrix3x3t<float> *)local_b8,(aiMatrix3x3t<float> *)local_f8);
        }
        else if (local_fc == Channel_RotationY) {
          fVar22 = cosf(fVar21);
          local_f8._8_4_ = sinf(fVar21);
          local_f8._4_4_ = 0;
          local_f8._0_4_ = fVar22;
          local_f8._12_4_ = 0.0;
          local_f8._16_4_ = 1.0;
          local_f8._20_8_ = (ulong)(uint)local_f8._8_4_ << 0x20 ^ 0x8000000000000000;
          uStack_dc = (ulong)(uint)fVar22 << 0x20;
          aiMatrix3x3t<float>::operator*=
                    ((aiMatrix3x3t<float> *)local_b8,(aiMatrix3x3t<float> *)local_f8);
        }
        else if (local_fc == Channel_RotationX) {
          fVar22 = cosf(fVar21);
          fVar21 = sinf(fVar21);
          local_f8._0_8_ = (pointer)0x3f800000;
          local_f8._8_4_ = 0.0;
          local_f8._12_4_ = 0.0;
          local_f8._24_4_ = 0;
          local_f8._20_4_ = -fVar21;
          uStack_dc = CONCAT44(fVar22,fVar21);
          local_f8._16_4_ = fVar22;
          aiMatrix3x3t<float>::operator*=
                    ((aiMatrix3x3t<float> *)local_b8,(aiMatrix3x3t<float> *)local_f8);
        }
      }
      paVar15->mTime = (double)(uVar10 & 0xffffffff);
      aiQuaterniont<float>::aiQuaterniont
                ((aiQuaterniont<float> *)local_f8,(aiMatrix3x3t<float> *)local_b8);
      (paVar15->mValue).w = (float)local_f8._0_4_;
      (paVar15->mValue).x = (float)local_f8._4_4_;
      (paVar15->mValue).y = (float)local_f8._8_4_;
      (paVar15->mValue).z = (float)local_f8._12_4_;
      paVar15 = paVar15 + 1;
      uVar8 = (ulong)local_d0->mAnimNumFrames;
    }
    paVar11->mNumScalingKeys = 1;
    paVar13 = (aiVectorKey *)operator_new__(0x18);
    paVar13->mTime = 0.0;
    *local_90 = paVar13;
    (paVar13->mValue).x = 1.0;
    (paVar13->mValue).y = 1.0;
    (paVar13->mValue).z = 1.0;
    std::
    _Rb_tree<Assimp::BVHLoader::ChannelType,_std::pair<const_Assimp::BVHLoader::ChannelType,_int>,_std::_Select1st<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>,_std::less<Assimp::BVHLoader::ChannelType>,_std::allocator<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>_>
    ::~_Rb_tree((_Rb_tree<Assimp::BVHLoader::ChannelType,_std::pair<const_Assimp::BVHLoader::ChannelType,_int>,_std::_Select1st<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>,_std::less<Assimp::BVHLoader::ChannelType>,_std::allocator<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>_>
                 *)&channelMap);
    std::__cxx11::string::~string((string *)&nodeName);
    uVar10 = local_88 + 1;
    uVar8 = (ulong)local_c8->mNumChannels;
  } while( true );
}

Assistant:

void BVHLoader::CreateAnimation( aiScene* pScene)
{
    // create the animation
    pScene->mNumAnimations = 1;
    pScene->mAnimations = new aiAnimation*[1];
    aiAnimation* anim = new aiAnimation;
    pScene->mAnimations[0] = anim;

    // put down the basic parameters
    anim->mName.Set( "Motion");
    anim->mTicksPerSecond = 1.0 / double( mAnimTickDuration);
    anim->mDuration = double( mAnimNumFrames - 1);

    // now generate the tracks for all nodes
    anim->mNumChannels = static_cast<unsigned int>(mNodes.size());
    anim->mChannels = new aiNodeAnim*[anim->mNumChannels];

    // FIX: set the array elements to NULL to ensure proper deletion if an exception is thrown
    for (unsigned int i = 0; i < anim->mNumChannels;++i)
        anim->mChannels[i] = NULL;

    for( unsigned int a = 0; a < anim->mNumChannels; a++)
    {
        const Node& node = mNodes[a];
        const std::string nodeName = std::string( node.mNode->mName.data );
        aiNodeAnim* nodeAnim = new aiNodeAnim;
        anim->mChannels[a] = nodeAnim;
        nodeAnim->mNodeName.Set( nodeName);
		std::map<BVHLoader::ChannelType, int> channelMap;

		//Build map of channels 
		for (unsigned int channel = 0; channel < node.mChannels.size(); ++channel)
		{
			channelMap[node.mChannels[channel]] = channel;
		}

        // translational part, if given
        if( node.mChannels.size() == 6)
        {
            nodeAnim->mNumPositionKeys = mAnimNumFrames;
            nodeAnim->mPositionKeys = new aiVectorKey[mAnimNumFrames];
            aiVectorKey* poskey = nodeAnim->mPositionKeys;
            for( unsigned int fr = 0; fr < mAnimNumFrames; ++fr)
            {
                poskey->mTime = double( fr);

                // Now compute all translations 
                for(BVHLoader::ChannelType channel = Channel_PositionX; channel <= Channel_PositionZ; channel = (BVHLoader::ChannelType)(channel +1))
                {
					//Find channel in node
					std::map<BVHLoader::ChannelType, int>::iterator mapIter = channelMap.find(channel);

					if (mapIter == channelMap.end())
						throw DeadlyImportError("Missing position channel in node " + nodeName);
					else {
						int channelIdx = mapIter->second;
						switch (channel) {
						    case Channel_PositionX: 
                                poskey->mValue.x = node.mChannelValues[fr * node.mChannels.size() + channelIdx]; 
                                break;
						    case Channel_PositionY: 
                                poskey->mValue.y = node.mChannelValues[fr * node.mChannels.size() + channelIdx]; 
                                break;
						    case Channel_PositionZ: 
                                poskey->mValue.z = node.mChannelValues[fr * node.mChannels.size() + channelIdx]; 
                                break;
                                
                            default:
                                break;
						}

					}
                }
                ++poskey;
            }
        } else
        {
            // if no translation part is given, put a default sequence
            aiVector3D nodePos( node.mNode->mTransformation.a4, node.mNode->mTransformation.b4, node.mNode->mTransformation.c4);
            nodeAnim->mNumPositionKeys = 1;
            nodeAnim->mPositionKeys = new aiVectorKey[1];
            nodeAnim->mPositionKeys[0].mTime = 0.0;
            nodeAnim->mPositionKeys[0].mValue = nodePos;
        }

        // rotation part. Always present. First find value offsets
        {

            // Then create the number of rotation keys
            nodeAnim->mNumRotationKeys = mAnimNumFrames;
            nodeAnim->mRotationKeys = new aiQuatKey[mAnimNumFrames];
            aiQuatKey* rotkey = nodeAnim->mRotationKeys;
            for( unsigned int fr = 0; fr < mAnimNumFrames; ++fr)
            {
                aiMatrix4x4 temp;
                aiMatrix3x3 rotMatrix;
				for (BVHLoader::ChannelType channel = Channel_RotationX; channel <= Channel_RotationZ; channel = (BVHLoader::ChannelType)(channel + 1))
				{
					//Find channel in node
					std::map<BVHLoader::ChannelType, int>::iterator mapIter = channelMap.find(channel);

					if (mapIter == channelMap.end())
						throw DeadlyImportError("Missing rotation channel in node " + nodeName);
					else {
						int channelIdx = mapIter->second;
						// translate ZXY euler angels into a quaternion
						const float angle = node.mChannelValues[fr * node.mChannels.size() + channelIdx] * float(AI_MATH_PI) / 180.0f;

						// Compute rotation transformations in the right order
						switch (channel)
						{
							case Channel_RotationX: 
                                aiMatrix4x4::RotationX(angle, temp); rotMatrix *= aiMatrix3x3(temp); 
                                break;
							case Channel_RotationY: 
                                aiMatrix4x4::RotationY(angle, temp); rotMatrix *= aiMatrix3x3(temp);  
                                break;
							case Channel_RotationZ: aiMatrix4x4::RotationZ(angle, temp); rotMatrix *= aiMatrix3x3(temp); 
                                break;
                            default:
                                break;
						}
					}
                }

                rotkey->mTime = double( fr);
                rotkey->mValue = aiQuaternion( rotMatrix);
                ++rotkey;
            }
        }

        // scaling part. Always just a default track
        {
            nodeAnim->mNumScalingKeys = 1;
            nodeAnim->mScalingKeys = new aiVectorKey[1];
            nodeAnim->mScalingKeys[0].mTime = 0.0;
            nodeAnim->mScalingKeys[0].mValue.Set( 1.0f, 1.0f, 1.0f);
        }
    }
}